

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

bool ZXing::Aztec::IsBetterThanOrEqualTo(EncodingState *state,EncodingState *other)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  EncodingState *in_RSI;
  EncodingState *in_RDI;
  int newModeBitCount;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_14;
  
  local_14 = in_RDI->bitCount;
  std::array<std::array<int,_5UL>,_5UL>::operator[]
            ((array<std::array<int,_5UL>,_5UL> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  pvVar3 = std::array<int,_5UL>::operator[]
                     ((array<int,_5UL> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  local_14 = local_14 + (*pvVar3 >> 0x10);
  if (in_RDI->binaryShiftByteCount < in_RSI->binaryShiftByteCount) {
    iVar1 = CalculateBinaryShiftCost(in_RSI);
    iVar2 = CalculateBinaryShiftCost(in_RDI);
    local_14 = (iVar1 - iVar2) + local_14;
  }
  else if ((in_RSI->binaryShiftByteCount < in_RDI->binaryShiftByteCount) &&
          (0 < in_RSI->binaryShiftByteCount)) {
    local_14 = local_14 + 10;
  }
  return local_14 <= in_RSI->bitCount;
}

Assistant:

static bool IsBetterThanOrEqualTo(const EncodingState& state, const EncodingState& other)
{
	int newModeBitCount = state.bitCount + (LATCH_TABLE[state.mode][other.mode] >> 16);
	if (state.binaryShiftByteCount < other.binaryShiftByteCount) {
		// add additional B/S encoding cost of other, if any
		newModeBitCount += CalculateBinaryShiftCost(other) - CalculateBinaryShiftCost(state);
	}
	else if (state.binaryShiftByteCount > other.binaryShiftByteCount && other.binaryShiftByteCount > 0) {
		// maximum possible additional cost (we end up exceeding the 31 byte boundary and other state can stay beneath it)
		newModeBitCount += 10;
	}
	return newModeBitCount <= other.bitCount;
}